

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder_internal.h
# Opt level: O3

int __thiscall basist::huffman_decoding_table::init(huffman_decoding_table *this,EVP_PKEY_CTX *ctx)

{
  int_vec *this_00;
  int16_vec *this_01;
  int *piVar1;
  byte bVar2;
  short sVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  ulong extraout_RAX;
  uint in_ECX;
  uint uVar8;
  long lVar9;
  char *__function;
  void *in_RDX;
  uint32_t new_size_1;
  uint uVar10;
  uint32_t new_size;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  uint uVar15;
  ulong __n;
  ulong uVar16;
  uint32_t syms_using_codesize [32];
  undefined8 local_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  uint auStack_b8 [34];
  
  uVar15 = (uint)ctx;
  if (uVar15 == 0) {
    clear(this);
    uVar7 = extraout_RAX;
  }
  else {
    __n = (ulong)ctx & 0xffffffff;
    uVar10 = (this->m_code_sizes).m_size;
    if (uVar10 != uVar15) {
      if (uVar10 <= uVar15) {
        if ((this->m_code_sizes).m_capacity < uVar15) {
          basisu::elemental_vector::increase_capacity
                    ((elemental_vector *)this,uVar15,uVar10 + 1 == uVar15,1,(object_mover)0x0,false)
          ;
          uVar10 = (this->m_code_sizes).m_size;
        }
        memset((this->m_code_sizes).m_p + uVar10,0,(ulong)(uVar15 - uVar10));
      }
      (this->m_code_sizes).m_size = uVar15;
    }
    memcpy((this->m_code_sizes).m_p,in_RDX,__n);
    uVar10 = 1 << ((byte)in_ECX & 0x1f);
    if ((this->m_lookup).m_size != 0) {
      (this->m_lookup).m_size = 0;
    }
    this_00 = &this->m_lookup;
    uVar8 = 0;
    if ((this->m_lookup).m_capacity < uVar10) {
      basisu::elemental_vector::increase_capacity
                ((elemental_vector *)this_00,uVar10,in_ECX == 0,4,(object_mover)0x0,false);
      uVar8 = (this->m_lookup).m_size;
    }
    memset((this->m_lookup).m_p + uVar8,0,(ulong)(uVar10 - uVar8) << 2);
    (this->m_lookup).m_size = uVar10;
    if ((this->m_tree).m_size != 0) {
      (this->m_tree).m_size = 0;
    }
    this_01 = &this->m_tree;
    uVar8 = uVar15 * 2;
    if (uVar8 != 0) {
      uVar5 = 0;
      if ((this->m_tree).m_capacity < uVar8) {
        basisu::elemental_vector::increase_capacity
                  ((elemental_vector *)this_01,uVar8,false,2,(object_mover)0x0,false);
        uVar5 = (this->m_tree).m_size;
      }
      memset((this->m_tree).m_p + uVar5,0,(ulong)(uVar8 - uVar5) * 2);
      (this->m_tree).m_size = uVar8;
    }
    local_c8 = 0;
    uStack_c0 = 0;
    local_d8 = 0;
    uStack_d0 = 0;
    local_e8 = 0;
    uStack_e0 = 0;
    local_f8 = 0;
    uStack_f0 = 0;
    local_108 = 0;
    uStack_100 = 0;
    local_118 = 0;
    uStack_110 = 0;
    local_128 = 0;
    uStack_120 = 0;
    local_138 = 0;
    uStack_130 = 0;
    uVar7 = 0;
    do {
      if (0x1f < (ulong)*(byte *)((long)in_RDX + uVar7)) {
        return 0;
      }
      piVar1 = (int *)((long)&local_138 + (ulong)*(byte *)((long)in_RDX + uVar7) * 4);
      *piVar1 = *piVar1 + 1;
      uVar7 = uVar7 + 1;
    } while (__n != uVar7);
    auStack_b8[1] = 0;
    uVar5 = 0;
    lVar9 = 2;
    uVar8 = 0;
    do {
      iVar14 = *(int *)((long)&local_140 + lVar9 * 4 + 4);
      uVar5 = uVar5 + iVar14;
      uVar8 = (uVar8 + iVar14) * 2;
      auStack_b8[lVar9] = uVar8;
      lVar9 = lVar9 + 1;
    } while (lVar9 != 0x20);
    uVar7 = (ulong)CONCAT31((int3)(uVar5 >> 8),1 < uVar5);
    if (1 < uVar5) {
      return 0;
    }
    if (0 < (int)uVar15) {
      uVar7 = (ulong)(in_ECX - 1);
      uVar16 = 0xffffffff;
      uVar12 = 0;
      do {
        bVar2 = *(byte *)((long)in_RDX + uVar12);
        uVar11 = (ulong)bVar2;
        uVar15 = (uint)uVar16;
        if (bVar2 != 0) {
          uVar7 = (ulong)auStack_b8[uVar11];
          auStack_b8[uVar11] = auStack_b8[uVar11] + 1;
          uVar13 = 0;
          uVar8 = (uint)bVar2;
          do {
            uVar5 = ((uint)uVar7 & 1) + (int)uVar13 * 2;
            uVar13 = (ulong)uVar5;
            uVar7 = uVar7 >> 1;
            uVar8 = uVar8 - 1;
          } while (uVar8 != 0);
          uVar8 = (uint)bVar2;
          if (in_ECX < bVar2) {
            uVar6 = uVar5 & uVar10 - 1;
            if ((this->m_lookup).m_size <= uVar6) {
LAB_0013b763:
              __function = "T &basisu::vector<int>::operator[](size_t) [T = int]";
LAB_0013b78f:
              __assert_fail("i < m_size",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_containers.h"
                            ,0x178,__function);
            }
            uVar4 = this_00->m_p[uVar6];
            if (uVar4 == 0) {
              this_00->m_p[uVar6] = uVar15;
              uVar7 = (ulong)(uVar15 - 2);
            }
            else {
              uVar7 = uVar16;
              uVar16 = (ulong)uVar4;
            }
            iVar14 = (int)uVar16;
            if (-1 < iVar14) {
              return 0;
            }
            uVar5 = uVar5 >> ((byte)(in_ECX - 1) & 0x1f);
            while ((int)(in_ECX + 1) < (int)uVar8) {
              uVar15 = (int)uVar16 - (uint)((uVar5 >> 1 & 1) != 0);
              if (-1 < (int)uVar15) {
                return 0;
              }
              uVar6 = -uVar15;
              uVar15 = ~uVar15;
              uVar8 = (this->m_tree).m_size;
              if (uVar8 != uVar6 && (int)uVar8 <= (int)uVar15) {
                if (uVar8 <= uVar6) {
                  local_140 = uVar7;
                  if ((this->m_tree).m_capacity < uVar6) {
                    basisu::elemental_vector::increase_capacity
                              ((elemental_vector *)this_01,uVar6,uVar8 + 1 == uVar6,2,
                               (object_mover)0x0,false);
                    uVar8 = (this->m_tree).m_size;
                  }
                  memset(this_01->m_p + uVar8,0,(ulong)(uVar6 - uVar8) * 2);
                  uVar7 = local_140;
                }
                (this->m_tree).m_size = uVar6;
                uVar8 = uVar6;
              }
              if (uVar8 <= uVar15) goto LAB_0013b77a;
              sVar3 = this_01->m_p[uVar15];
              uVar16 = (ulong)(uint)(int)sVar3;
              if ((int)sVar3 == 0) {
                this_01->m_p[uVar15] = (short)uVar7;
                uVar16 = uVar7 & 0xffffffff;
                uVar7 = (ulong)((int)uVar7 - 2);
              }
              else if (-1 < sVar3) {
                return 0;
              }
              iVar14 = (int)uVar16;
              uVar5 = uVar5 >> 1;
              uVar8 = (int)uVar11 - 1;
              uVar11 = (ulong)uVar8;
            }
            uVar8 = iVar14 - (uint)((uVar5 >> 1 & 1) != 0);
            uVar15 = -uVar8;
            if ((int)uVar15 < 1) {
              return 0;
            }
            uVar5 = (this->m_tree).m_size;
            if ((int)uVar5 < (int)uVar15) {
              if (uVar5 <= uVar15) {
                if ((this->m_tree).m_capacity < uVar15) {
                  basisu::elemental_vector::increase_capacity
                            ((elemental_vector *)this_01,uVar15,uVar5 + 1 == uVar15,2,
                             (object_mover)0x0,false);
                  uVar5 = (this->m_tree).m_size;
                }
                memset(this_01->m_p + uVar5,0,(ulong)(uVar15 - uVar5) * 2);
              }
              (this->m_tree).m_size = uVar15;
              uVar5 = uVar15;
            }
            uVar15 = (uint)uVar7;
            uVar8 = ~uVar8;
            if (uVar5 <= uVar8) {
LAB_0013b77a:
              __function = "T &basisu::vector<short>::operator[](size_t) [T = short]";
              goto LAB_0013b78f;
            }
            uVar7 = (ulong)uVar8;
            if (this_01->m_p[uVar7] != 0) {
              return 0;
            }
            this_01->m_p[uVar7] = (short)uVar12;
          }
          else if (uVar5 < uVar10) {
            uVar8 = (uint)uVar12 | uVar8 << 0x10;
            uVar7 = (ulong)uVar8;
            do {
              if ((this->m_lookup).m_size <= (uint)uVar13) goto LAB_0013b763;
              if (this_00->m_p[uVar13] != 0) {
                return 0;
              }
              this_00->m_p[uVar13] = uVar8;
              uVar5 = (uint)uVar13 + (1 << (bVar2 & 0x1f));
              uVar13 = (ulong)uVar5;
            } while (uVar5 < uVar10);
          }
        }
        uVar12 = uVar12 + 1;
        uVar16 = (ulong)uVar15;
        if (uVar12 == __n) {
          return (int)CONCAT71((int7)(uVar7 >> 8),__n <= uVar12);
        }
      } while( true );
    }
  }
  return (int)CONCAT71((int7)(uVar7 >> 8),1);
}

Assistant:

bool init(uint32_t total_syms, const uint8_t *pCode_sizes, uint32_t fast_lookup_bits = basisu::cHuffmanFastLookupBits)
		{
			if (!total_syms)
			{
				clear();
				return true;
			}

			m_code_sizes.resize(total_syms);
			memcpy(&m_code_sizes[0], pCode_sizes, total_syms);

			const uint32_t huffman_fast_lookup_size = 1 << fast_lookup_bits;

			m_lookup.resize(0);
			m_lookup.resize(huffman_fast_lookup_size);

			m_tree.resize(0);
			m_tree.resize(total_syms * 2);

			uint32_t syms_using_codesize[basisu::cHuffmanMaxSupportedInternalCodeSize + 1];
			basisu::clear_obj(syms_using_codesize);
			for (uint32_t i = 0; i < total_syms; i++)
			{
				if (pCode_sizes[i] > basisu::cHuffmanMaxSupportedInternalCodeSize)
					return false;
				syms_using_codesize[pCode_sizes[i]]++;
			}

			uint32_t next_code[basisu::cHuffmanMaxSupportedInternalCodeSize + 1];
			next_code[0] = next_code[1] = 0;

			uint32_t used_syms = 0, total = 0;
			for (uint32_t i = 1; i < basisu::cHuffmanMaxSupportedInternalCodeSize; i++)
			{
				used_syms += syms_using_codesize[i];
				next_code[i + 1] = (total = ((total + syms_using_codesize[i]) << 1));
			}

			if (((1U << basisu::cHuffmanMaxSupportedInternalCodeSize) != total) && (used_syms > 1U))
				return false;

			for (int tree_next = -1, sym_index = 0; sym_index < (int)total_syms; ++sym_index)
			{
				uint32_t rev_code = 0, l, cur_code, code_size = pCode_sizes[sym_index];
				if (!code_size)
					continue;

				cur_code = next_code[code_size]++;

				for (l = code_size; l > 0; l--, cur_code >>= 1)
					rev_code = (rev_code << 1) | (cur_code & 1);

				if (code_size <= fast_lookup_bits)
				{
					uint32_t k = (code_size << 16) | sym_index;
					while (rev_code < huffman_fast_lookup_size)
					{
						if (m_lookup[rev_code] != 0)
						{
							// Supplied codesizes can't create a valid prefix code.
							return false;
						}

						m_lookup[rev_code] = k;
						rev_code += (1 << code_size);
					}
					continue;
				}

				int tree_cur;
				if (0 == (tree_cur = m_lookup[rev_code & (huffman_fast_lookup_size - 1)]))
				{
					const uint32_t idx = rev_code & (huffman_fast_lookup_size - 1);
					if (m_lookup[idx] != 0)
					{
						// Supplied codesizes can't create a valid prefix code.
						return false;
					}

					m_lookup[idx] = tree_next;
					tree_cur = tree_next;
					tree_next -= 2;
				}

				if (tree_cur >= 0)
				{
					// Supplied codesizes can't create a valid prefix code.
					return false;
				}

				rev_code >>= (fast_lookup_bits - 1);

				for (int j = code_size; j > ((int)fast_lookup_bits + 1); j--)
				{
					tree_cur -= ((rev_code >>= 1) & 1);

					const int idx = -tree_cur - 1;
					if (idx < 0)
						return false;
					else if (idx >= (int)m_tree.size())
						m_tree.resize(idx + 1);
										
					if (!m_tree[idx])
					{
						m_tree[idx] = (int16_t)tree_next;
						tree_cur = tree_next;
						tree_next -= 2;
					}
					else
					{
						tree_cur = m_tree[idx];
						if (tree_cur >= 0)
						{
							// Supplied codesizes can't create a valid prefix code.
							return false;
						}
					}
				}

				tree_cur -= ((rev_code >>= 1) & 1);

				const int idx = -tree_cur - 1;
				if (idx < 0)
					return false;
				else if (idx >= (int)m_tree.size())
					m_tree.resize(idx + 1);

				if (m_tree[idx] != 0)
				{
					// Supplied codesizes can't create a valid prefix code.
					return false;
				}

				m_tree[idx] = (int16_t)sym_index;
			}

			return true;
		}